

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrohnerBackgroundRMatrix.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix::
print<std::back_insert_iterator<std::__cxx11::string>>
          (FrohnerBackgroundRMatrix *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  initializer_list<double> __l;
  allocator_type local_c9;
  vector<double,_std::allocator<double>_> local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [48];
  pointer local_68;
  pointer local_60;
  pointer local_58;
  double local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_98._24_8_ = SEXT48(*(int *)this);
  local_98._0_8_ = 0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 3;
  local_98._32_16_ = ZEXT816(0);
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_98,it,MAT,MF,MT);
  local_48 = *(double *)(this + 0x18);
  uStack_40 = *(undefined8 *)(this + 0x20);
  local_38 = *(undefined8 *)(this + 0x28);
  local_a8 = *(undefined8 *)(this + 8);
  uStack_a0 = *(undefined8 *)(this + 0x10);
  __l._M_len = 3;
  __l._M_array = &local_48;
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,__l,&local_c9);
  local_98._8_8_ =
       (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_98._0_8_ = 0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_98._40_4_ = (int)local_a8;
  local_98._32_8_ = uStack_a0;
  local_98._44_4_ = (int)((ulong)local_a8 >> 0x20);
  local_68 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_58 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ListRecord *)local_98,it,MAT,MF,MT);
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

    ControlRecord( 0.0, 0.0, this->LCH(),
                   this->LBK(), 0, 0 ).print( it, MAT, MF, MT );
    ListRecord( this->ED(), this->EU(), 0 ,0, 0,
                { this->R0(), this->S0(),
                  this->GA() } ).print( it, MAT, MF, MT );
  }